

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmFGen<(moira::Instr)149,(moira::Mode)1,0>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  byte bVar1;
  bool bVar2;
  u32 uVar3;
  u8 cmd;
  u8 cod;
  u32 ext;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  uVar3 = dasmIncRead<2>(this,addr);
  bVar1 = (byte)uVar3 & 0x7f;
  *addr = *addr - 2;
  if ((uVar3 & 0x4000) != 0) {
    dasmLineF<(moira::Instr)149,(moira::Mode)1,0>(this,str,addr,op);
    return;
  }
  switch((byte)(uVar3 >> 0xd) & 7) {
  case 2:
    if ((uVar3 & 0xfc00) == 0x5c00) {
      dasmFMovecr<(moira::Instr)237,(moira::Mode)1,0>(this,str,addr,op);
      return;
    }
  case 0:
    if ((((uVar3 & 0x7f) == 0) || (bVar1 == 0x40)) || (bVar1 == 0x44)) {
switchD_0031883d_caseD_3:
      dasmFMove<(moira::Instr)192,(moira::Mode)1,0>(this,str,addr,op);
      return;
    }
    break;
  case 3:
    goto switchD_0031883d_caseD_3;
  case 4:
  case 5:
  case 6:
  case 7:
    dasmFMovem<(moira::Instr)193,(moira::Mode)1,0>(this,str,addr,op);
    return;
  }
  if ((uVar3 >> 0xd & 5) != 0) goto LAB_00318f08;
  switch(bVar1) {
  case 1:
    dasmFGeneric<(moira::Instr)230,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 2:
    dasmFGeneric<(moira::Instr)244,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 3:
    dasmFGeneric<(moira::Instr)231,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 4:
    dasmFGeneric<(moira::Instr)200,(moira::Mode)1,0>(this,str,addr,op);
    break;
  default:
    bVar2 = hasFPU(this);
    if (bVar2) {
      switch(bVar1) {
      case 0x41:
        dasmFGeneric<(moira::Instr)216,(moira::Mode)1,0>(this,str,addr,op);
        break;
      default:
        goto LAB_00318f08;
      case 0x45:
        dasmFGeneric<(moira::Instr)217,(moira::Mode)1,0>(this,str,addr,op);
        break;
      case 0x58:
        dasmFGeneric<(moira::Instr)204,(moira::Mode)1,0>(this,str,addr,op);
        break;
      case 0x5a:
        dasmFGeneric<(moira::Instr)214,(moira::Mode)1,0>(this,str,addr,op);
        break;
      case 0x5c:
        dasmFGeneric<(moira::Instr)205,(moira::Mode)1,0>(this,str,addr,op);
        break;
      case 0x5e:
        dasmFGeneric<(moira::Instr)215,(moira::Mode)1,0>(this,str,addr,op);
        break;
      case 0x60:
        dasmFGeneric<(moira::Instr)208,(moira::Mode)1,0>(this,str,addr,op);
        break;
      case 0x62:
        dasmFGeneric<(moira::Instr)206,(moira::Mode)1,0>(this,str,addr,op);
        break;
      case 99:
        dasmFGeneric<(moira::Instr)212,(moira::Mode)1,0>(this,str,addr,op);
        break;
      case 100:
        dasmFGeneric<(moira::Instr)209,(moira::Mode)1,0>(this,str,addr,op);
        break;
      case 0x66:
        dasmFGeneric<(moira::Instr)207,(moira::Mode)1,0>(this,str,addr,op);
        break;
      case 0x67:
        dasmFGeneric<(moira::Instr)213,(moira::Mode)1,0>(this,str,addr,op);
        break;
      case 0x68:
        dasmFGeneric<(moira::Instr)218,(moira::Mode)1,0>(this,str,addr,op);
        break;
      case 0x6c:
        dasmFGeneric<(moira::Instr)219,(moira::Mode)1,0>(this,str,addr,op);
      }
    }
    else {
LAB_00318f08:
      dasmLineF<(moira::Instr)149,(moira::Mode)1,0>(this,str,addr,op);
    }
    break;
  case 6:
    dasmFGeneric<(moira::Instr)235,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 8:
    dasmFGeneric<(moira::Instr)227,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 9:
    dasmFGeneric<(moira::Instr)246,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 10:
    dasmFGeneric<(moira::Instr)222,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0xc:
    dasmFGeneric<(moira::Instr)221,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0xd:
    dasmFGeneric<(moira::Instr)223,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0xe:
    dasmFGeneric<(moira::Instr)242,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0xf:
    dasmFGeneric<(moira::Instr)245,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0x10:
    dasmFGeneric<(moira::Instr)226,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0x11:
    dasmFGeneric<(moira::Instr)248,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0x12:
    dasmFGeneric<(moira::Instr)247,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0x14:
    dasmFGeneric<(moira::Instr)234,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0x15:
    dasmFGeneric<(moira::Instr)232,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0x16:
    dasmFGeneric<(moira::Instr)233,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0x18:
    dasmFGeneric<(moira::Instr)186,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0x19:
    dasmFGeneric<(moira::Instr)225,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0x1a:
    dasmFGeneric<(moira::Instr)195,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0x1c:
    dasmFGeneric<(moira::Instr)220,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0x1d:
    dasmFGeneric<(moira::Instr)224,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0x1e:
    dasmFGeneric<(moira::Instr)228,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0x1f:
    dasmFGeneric<(moira::Instr)229,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0x20:
    dasmFGeneric<(moira::Instr)191,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0x21:
    dasmFGeneric<(moira::Instr)236,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0x22:
    dasmFGeneric<(moira::Instr)187,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0x23:
    dasmFGeneric<(moira::Instr)194,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0x24:
    dasmFGeneric<(moira::Instr)240,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0x25:
    dasmFGeneric<(moira::Instr)238,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0x26:
    dasmFGeneric<(moira::Instr)239,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0x27:
    dasmFGeneric<(moira::Instr)241,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0x28:
    dasmFGeneric<(moira::Instr)201,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0x30:
    dasmFGeneric2<(moira::Instr)243,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0x31:
    dasmFGeneric2<(moira::Instr)243,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0x32:
    dasmFGeneric2<(moira::Instr)243,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0x33:
    dasmFGeneric2<(moira::Instr)243,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0x34:
    dasmFGeneric2<(moira::Instr)243,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0x35:
    dasmFGeneric2<(moira::Instr)243,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0x36:
    dasmFGeneric2<(moira::Instr)243,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0x37:
    dasmFGeneric2<(moira::Instr)243,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0x38:
    dasmFGeneric<(moira::Instr)189,(moira::Mode)1,0>(this,str,addr,op);
    break;
  case 0x3a:
    dasmFGeneric3<(moira::Instr)203,(moira::Mode)1,0>(this,str,addr,op);
  }
  return;
}

Assistant:

void
Moira::dasmFGen(StrWriter &str, u32 &addr, u16 op) const
{
    auto ext  = dasmIncRead<Word>(addr);
    auto cod  = xxx_____________(ext);
    auto cmd  = _________xxxxxxx(ext);
    addr -= 2;

    if (M == Mode::AN) {
        if (ext & 0x4000) { dasmLineF<I, M, S>(str, addr, op); return; }
    }
    if (M == Mode::IP) {
        if (cod == 0b010) { dasmLineF<I, M, S>(str, addr, op); return; }
    }

    // Catch FMOVE instructions
    switch (cod) {

        case 0b010:

            if ((ext & 0xFC00) == 0x5C00) { dasmFMovecr<Instr::FMOVECR, M, S>(str, addr, op); return; }
            [[fallthrough]];

        case 0b000:

            if (cmd != 0x00 && cmd != 0x40 && cmd != 0x44) break;
            [[fallthrough]];

        case 0b011:

            dasmFMove<Instr::FMOVE, M, S>(str, addr, op);
            return;

        case 0b101:
        case 0b100:
        case 0b110:
        case 0b111:

            dasmFMovem<Instr::FMOVEM, M, S>(str, addr, op);
            return;
    }

    // Catch all other instructions
    switch (cod) {

        case 0b010:
        case 0b000:

            switch (cmd) {

                case 0x01: dasmFGeneric<Instr::FINT, M, S>(str, addr, op); return;
                case 0x02: dasmFGeneric<Instr::FSINH, M, S>(str, addr, op); return;
                case 0x03: dasmFGeneric<Instr::FINTRZ, M, S>(str, addr, op); return;
                case 0x04: dasmFGeneric<Instr::FSQRT, M, S>(str, addr, op); return;
                case 0x06: dasmFGeneric<Instr::FLOGNP1, M, S>(str, addr, op); return;
                case 0x08: dasmFGeneric<Instr::FETOXM1, M, S>(str, addr, op); return;
                case 0x09: dasmFGeneric<Instr::FTANH, M, S>(str, addr, op); return;
                case 0x0A: dasmFGeneric<Instr::FATAN, M, S>(str, addr, op); return;
                case 0x0C: dasmFGeneric<Instr::FASIN, M, S>(str, addr, op); return;
                case 0x0D: dasmFGeneric<Instr::FATANH, M, S>(str, addr, op); return;
                case 0x0E: dasmFGeneric<Instr::FSIN, M, S>(str, addr, op); return;
                case 0x0F: dasmFGeneric<Instr::FTAN, M, S>(str, addr, op); return;
                case 0x10: dasmFGeneric<Instr::FETOX, M, S>(str, addr, op); return;
                case 0x11: dasmFGeneric<Instr::FTWOTOX, M, S>(str, addr, op); return;
                case 0x12: dasmFGeneric<Instr::FTENTOX, M, S>(str, addr, op); return;
                case 0x14: dasmFGeneric<Instr::FLOGN, M, S>(str, addr, op); return;
                case 0x15: dasmFGeneric<Instr::FLOG10, M, S>(str, addr, op); return;
                case 0x16: dasmFGeneric<Instr::FLOG2, M, S>(str, addr, op); return;
                case 0x18: dasmFGeneric<Instr::FABS, M, S>(str, addr, op); return;
                case 0x19: dasmFGeneric<Instr::FCOSH, M, S>(str, addr, op); return;
                case 0x1A: dasmFGeneric<Instr::FNEG, M, S>(str, addr, op); return;
                case 0x1C: dasmFGeneric<Instr::FACOS, M, S>(str, addr, op); return;
                case 0x1D: dasmFGeneric<Instr::FCOS, M, S>(str, addr, op); return;
                case 0x1E: dasmFGeneric<Instr::FGETEXP, M, S>(str, addr, op); return;
                case 0x1F: dasmFGeneric<Instr::FGETMAN, M, S>(str, addr, op); return;
                case 0x20: dasmFGeneric<Instr::FDIV, M, S>(str, addr, op); return;
                case 0x21: dasmFGeneric<Instr::FMOD, M, S>(str, addr, op); return;
                case 0x22: dasmFGeneric<Instr::FADD, M, S>(str, addr, op); return;
                case 0x23: dasmFGeneric<Instr::FMUL, M, S>(str, addr, op); return;
                case 0x24: dasmFGeneric<Instr::FSGLDIV, M, S>(str, addr, op); return;
                case 0x25: dasmFGeneric<Instr::FREM, M, S>(str, addr, op); return;
                case 0x26: dasmFGeneric<Instr::FSCAL, M, S>(str, addr, op); return;
                case 0x27: dasmFGeneric<Instr::FSGLMUL, M, S>(str, addr, op); return;
                case 0x28: dasmFGeneric<Instr::FSUB, M, S>(str, addr, op); return;
                case 0x30: dasmFGeneric2<Instr::FSINCOS, M, S>(str, addr, op); return;
                case 0x31: dasmFGeneric2<Instr::FSINCOS, M, S>(str, addr, op); return;
                case 0x32: dasmFGeneric2<Instr::FSINCOS, M, S>(str, addr, op); return;
                case 0x33: dasmFGeneric2<Instr::FSINCOS, M, S>(str, addr, op); return;
                case 0x34: dasmFGeneric2<Instr::FSINCOS, M, S>(str, addr, op); return;
                case 0x35: dasmFGeneric2<Instr::FSINCOS, M, S>(str, addr, op); return;
                case 0x36: dasmFGeneric2<Instr::FSINCOS, M, S>(str, addr, op); return;
                case 0x37: dasmFGeneric2<Instr::FSINCOS, M, S>(str, addr, op); return;
                case 0x38: dasmFGeneric<Instr::FCMP, M, S>(str, addr, op); return;
                case 0x3A: dasmFGeneric3<Instr::FTST, M, S>(str, addr, op); return;
            }

            // 68040 only instructions
            if (hasFPU()) {

                switch (cmd) {

                    case 0x41: dasmFGeneric<Instr::FSSQRT, M, S>(str, addr, op); return;
                    case 0x45: dasmFGeneric<Instr::FDSQRT, M, S>(str, addr, op); return;
                    case 0x58: dasmFGeneric<Instr::FSABS, M, S>(str, addr, op); return;
                    case 0x5A: dasmFGeneric<Instr::FSNEG, M, S>(str, addr, op); return;
                    case 0x5C: dasmFGeneric<Instr::FDABS, M, S>(str, addr, op); return;
                    case 0x5E: dasmFGeneric<Instr::FDNEG, M, S>(str, addr, op); return;
                    case 0x60: dasmFGeneric<Instr::FSDIV, M, S>(str, addr, op); return;
                    case 0x62: dasmFGeneric<Instr::FSADD, M, S>(str, addr, op); return;
                    case 0x63: dasmFGeneric<Instr::FSMUL, M, S>(str, addr, op); return;
                    case 0x64: dasmFGeneric<Instr::FDDIV, M, S>(str, addr, op); return;
                    case 0x66: dasmFGeneric<Instr::FDADD, M, S>(str, addr, op); return;
                    case 0x67: dasmFGeneric<Instr::FDMUL, M, S>(str, addr, op); return;
                    case 0x68: dasmFGeneric<Instr::FSSUB, M, S>(str, addr, op); return;
                    case 0x6C: dasmFGeneric<Instr::FDSUB, M, S>(str, addr, op); return;
                }
            }

            break;
    }

    dasmLineF<I, M, S>(str, addr, op);
}